

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O3

void OpenSld(void)

{
  pointer pcVar1;
  pointer pbVar2;
  char cVar3;
  bool bVar4;
  pointer pbVar5;
  long *local_50 [2];
  long local_40 [2];
  
  if (FP_SourceLevelDebugging == (FILE *)0x0) {
    cVar3 = std::filesystem::__cxx11::path::has_filename();
    if ((cVar3 == '\0') && (Options::IsDefaultSldName == '\x01')) {
      ConstructDefaultFilename((path *)&Options::SourceLevelDebugFName_abi_cxx11_,"sld.txt",false);
    }
    cVar3 = std::filesystem::__cxx11::path::has_filename();
    if (cVar3 != '\0') {
      FP_SourceLevelDebugging = SJ_fopen((path *)&Options::SourceLevelDebugFName_abi_cxx11_,"w");
      if (FP_SourceLevelDebugging == (FILE *)0x0) {
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,Options::SourceLevelDebugFName_abi_cxx11_,
                   DAT_0018e4d0 + Options::SourceLevelDebugFName_abi_cxx11_);
        Error("opening file for write",(char *)local_50[0],FATAL);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
      }
      fputs("|SLD.data.version|1\n",(FILE *)FP_SourceLevelDebugging);
      if (sldCommentKeywords_abi_cxx11_.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          sldCommentKeywords_abi_cxx11_.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        fputs("||K|KEYWORDS|",(FILE *)FP_SourceLevelDebugging);
        pbVar2 = sldCommentKeywords_abi_cxx11_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (sldCommentKeywords_abi_cxx11_.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            sldCommentKeywords_abi_cxx11_.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          bVar4 = false;
          pbVar5 = sldCommentKeywords_abi_cxx11_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          do {
            pcVar1 = (pbVar5->_M_dataplus)._M_p;
            local_50[0] = local_40;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_50,pcVar1,pcVar1 + pbVar5->_M_string_length);
            if (bVar4) {
              fputs(",",(FILE *)FP_SourceLevelDebugging);
            }
            fputs((char *)local_50[0],(FILE *)FP_SourceLevelDebugging);
            if (local_50[0] != local_40) {
              operator_delete(local_50[0],local_40[0] + 1);
            }
            pbVar5 = pbVar5 + 1;
            bVar4 = true;
          } while (pbVar5 != pbVar2);
        }
        fputs(anon_var_dwarf_fc332 + 5,(FILE *)FP_SourceLevelDebugging);
      }
    }
  }
  return;
}

Assistant:

void OpenSld() {
	// check if source-level-debug file is already opened
	if (nullptr != FP_SourceLevelDebugging) return;
	// build default filename if not explicitly provided, and default was requested
	OpenSld_buildDefaultNameIfNeeded();
	// try to open it if not opened yet
	OpenSldImp(Options::SourceLevelDebugFName);
}